

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilIsop.c
# Opt level: O0

word Abc_Isop7Cover(word *pOn,word *pOnDc,word *pRes,word CostLim,int *pCover)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int *Cost;
  word *pOnDc_00;
  word Cost_00;
  word wVar4;
  int *local_d0;
  int *local_b0;
  int nVars;
  word Cost2;
  word Cost1;
  word Cost0;
  word uRes2;
  word uRes1;
  word uRes0;
  word uOnDc2;
  word uOn2;
  word uOn1;
  word uOn0;
  int *pCover_local;
  word CostLim_local;
  word *pRes_local;
  word *pOnDc_local;
  word *pOn_local;
  
  uOn0 = (word)pCover;
  pCover_local = (int *)CostLim;
  CostLim_local = (word)pRes;
  pRes_local = pOnDc;
  pOnDc_local = pOn;
  if ((*pOn & (*pOnDc ^ 0xffffffffffffffff)) != 0) {
    __assert_fail("(pOn[0] & ~pOnDc[0]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x99,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  if ((pOn[1] & (pOnDc[1] ^ 0xffffffffffffffff)) != 0) {
    __assert_fail("(pOn[1] & ~pOnDc[1]) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                  ,0x9a,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
  }
  uOn1 = *pOn & (pOnDc[1] ^ 0xffffffffffffffff);
  uOn2 = pOn[1] & (*pOnDc ^ 0xffffffffffffffff);
  Cost = (int *)Abc_IsopCheck(&uOn1,pOnDc,&uRes1,6,CostLim,pCover);
  piVar1 = pCover_local;
  wVar4 = uOn0;
  if (Cost < pCover_local) {
    pOnDc_00 = pRes_local + 1;
    if (uOn0 == 0) {
      local_b0 = (int *)0x0;
    }
    else {
      iVar2 = Abc_CostCubes((word)Cost);
      local_b0 = (int *)(wVar4 + (long)iVar2 * 4);
    }
    Cost_00 = Abc_IsopCheck(&uOn2,pOnDc_00,&uRes2,6,(word)piVar1,local_b0);
    piVar1 = pCover_local;
    wVar4 = uOn0;
    if ((int *)((long)Cost + Cost_00) < pCover_local) {
      uOnDc2 = *pOnDc_local & (uRes1 ^ 0xffffffffffffffff) |
               pOnDc_local[1] & (uRes2 ^ 0xffffffffffffffff);
      uRes0 = *pRes_local & pRes_local[1];
      if (uOn0 == 0) {
        local_d0 = (int *)0x0;
      }
      else {
        iVar2 = Abc_CostCubes((word)Cost);
        iVar3 = Abc_CostCubes(Cost_00);
        local_d0 = (int *)(wVar4 + (long)iVar2 * 4 + (long)iVar3 * 4);
      }
      wVar4 = Abc_IsopCheck(&uOnDc2,&uRes0,&Cost0,6,(word)piVar1,local_d0);
      if ((int *)((long)Cost + wVar4 + Cost_00) < pCover_local) {
        *(word *)CostLim_local = Cost0 | uRes1;
        *(word *)(CostLim_local + 8) = Cost0 | uRes2;
        if (((*pOnDc_local & (*(ulong *)CostLim_local ^ 0xffffffffffffffff)) != 0) ||
           ((*(ulong *)CostLim_local & (*pRes_local ^ 0xffffffffffffffff)) != 0)) {
          __assert_fail("(pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xaa,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        if (((pOnDc_local[1] & (*(ulong *)(CostLim_local + 8) ^ 0xffffffffffffffff)) != 0) ||
           ((*(ulong *)(CostLim_local + 8) & (pRes_local[1] ^ 0xffffffffffffffff)) != 0)) {
          __assert_fail("(pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilIsop.c"
                        ,0xab,"word Abc_Isop7Cover(word *, word *, word *, word, int *)");
        }
        Abc_IsopAddLits((int *)uOn0,(word)Cost,Cost_00,6);
        iVar2 = Abc_CostCubes((word)Cost);
        iVar3 = Abc_CostCubes(Cost_00);
        pOn_local = (word *)((long)Cost + (long)iVar3 + (long)iVar2 + wVar4 + Cost_00);
      }
      else {
        pOn_local = (word *)pCover_local;
      }
    }
    else {
      pOn_local = (word *)pCover_local;
    }
  }
  else {
    pOn_local = (word *)pCover_local;
  }
  return (word)pOn_local;
}

Assistant:

word Abc_Isop7Cover( word * pOn, word * pOnDc, word * pRes, word CostLim, int * pCover )
{
    word uOn0, uOn1, uOn2, uOnDc2, uRes0, uRes1, uRes2;
    word Cost0, Cost1, Cost2;  int nVars = 6; 
    assert( (pOn[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pOnDc[1]) == 0 );
    // cofactor
    uOn0 = pOn[0] & ~pOnDc[1];
    uOn1 = pOn[1] & ~pOnDc[0];
    // solve for cofactors
    Cost0 = Abc_IsopCheck( &uOn0, pOnDc,   &uRes0, nVars, CostLim, pCover );
    if ( Cost0 >= CostLim ) return CostLim;
    Cost1 = Abc_IsopCheck( &uOn1, pOnDc+1, &uRes1, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) : NULL );
    if ( Cost0 + Cost1 >= CostLim ) return CostLim;
    uOn2 = (pOn[0] & ~uRes0) | (pOn[1] & ~uRes1);
    uOnDc2 = pOnDc[0] & pOnDc[1];
    Cost2 = Abc_IsopCheck( &uOn2, &uOnDc2,  &uRes2, nVars, CostLim, pCover ? pCover + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1) : NULL );
    if ( Cost0 + Cost1 + Cost2 >= CostLim ) return CostLim;
    // derive the final truth table
    pRes[0] = uRes2 | uRes0;
    pRes[1] = uRes2 | uRes1;
    assert( (pOn[0] & ~pRes[0]) == 0 && (pRes[0] & ~pOnDc[0]) == 0 );
    assert( (pOn[1] & ~pRes[1]) == 0 && (pRes[1] & ~pOnDc[1]) == 0 );
    Abc_IsopAddLits( pCover, Cost0, Cost1, nVars );
    return Cost0 + Cost1 + Cost2 + Abc_CostCubes(Cost0) + Abc_CostCubes(Cost1);
}